

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeRowsBounds(Highs *this,HighsInt from_row,HighsInt to_row,double *lower,double *upper)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  allocator local_f9;
  string local_f8;
  HighsIndexCollection index_collection;
  HighsLogOptions local_88;
  
  clearDerivedModelProperties(this);
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  HVar1 = create(&index_collection,from_row,to_row,(this->model_).lp_.num_row_);
  if (HVar1 == 0) {
    HVar2 = changeRowBoundsInterface(this,&index_collection,lower,upper);
    HighsLogOptions::HighsLogOptions
              (&local_88,&(this->options_).super_HighsOptionsStruct.log_options);
    std::__cxx11::string::string((string *)&local_f8,"changeRowBounds",&local_f9);
    HVar2 = interpretCallStatus(&local_88,HVar2,kOk,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Function_base::~_Function_base(&local_88.user_callback.super__Function_base);
    if (HVar2 != kError) {
      HVar2 = returnFromHighs(this,HVar2);
      goto LAB_00239420;
    }
  }
  else {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Interval [%d, %d] supplied to Highs::changeRowsBounds is out of range [0, %d)\n",
                 (ulong)(uint)from_row,(ulong)(uint)to_row,(ulong)(uint)(this->model_).lp_.num_row_)
    ;
  }
  HVar2 = kError;
LAB_00239420:
  HighsIndexCollection::~HighsIndexCollection(&index_collection);
  return HVar2;
}

Assistant:

HighsStatus Highs::changeRowsBounds(const HighsInt from_row,
                                    const HighsInt to_row, const double* lower,
                                    const double* upper) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_row, to_row, model_.lp_.num_row_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::changeRowsBounds is out "
                 "of range [0, %d)\n",
                 int(from_row), int(to_row), int(model_.lp_.num_row_));
    return HighsStatus::kError;
  }
  HighsStatus call_status =
      changeRowBoundsInterface(index_collection, lower, upper);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeRowBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}